

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# special_functions.hpp
# Opt level: O1

longdouble *
trng::math::detail::Beta<long_double>(longdouble *__return_storage_ptr__,longdouble x,longdouble y)

{
  longdouble *plVar1;
  longdouble in_ST0;
  
  if (Beta<long_double>(long_double,long_double)::ln_max == '\0') {
    Beta<long_double>();
  }
  if ((longdouble)0 < x && (longdouble)0 < y) {
    logl();
    if (in_ST0 * (x + y) - (x + y) <= Beta<long_double>::ln_max) {
      tgammal();
      tgammal();
      plVar1 = (longdouble *)tgammal();
    }
    else {
      lgammal();
      lgammal();
      lgammal();
      plVar1 = (longdouble *)expl();
    }
  }
  else {
    plVar1 = (longdouble *)__errno_location();
    *(int *)plVar1 = 0x21;
  }
  return plVar1;
}

Assistant:

TRNG_CUDA_ENABLE T Beta(T x, T y) {
        static const T ln_max{ln(numeric_limits<T>::max())};
        if (x <= 0 or y <= 0) {
#if !(defined TRNG_CUDA)
          errno = EDOM;
#endif
          return numeric_limits<T>::signaling_NaN();
        }
        const T z{x + y};
        if (z * ln(z) - z > ln_max)
          // less accurate but avoids overflow
          return exp(ln_Gamma(x) + ln_Gamma(y) - ln_Gamma(z));
        return Gamma(x) / Gamma(z) * Gamma(y);
      }